

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

bool __thiscall ADehackedPickup::TryPickup(ADehackedPickup *this,AActor **toucher)

{
  byte *pbVar1;
  bool bVar2;
  PClassActor *type;
  AInventory *pAVar3;
  DVector3 local_38;
  
  type = DetermineType(this);
  if (type != (PClassActor *)0x0) {
    local_38.X = (this->super_AInventory).super_AActor.__Pos.X;
    local_38.Y = (this->super_AInventory).super_AActor.__Pos.Y;
    local_38.Z = (this->super_AInventory).super_AActor.__Pos.Z;
    pAVar3 = (AInventory *)AActor::StaticSpawn(type,&local_38,NO_REPLACE,false);
    this->RealPickup = pAVar3;
    if (pAVar3 == (AInventory *)0x0) {
      return false;
    }
    AActor::ClearCounters((AActor *)pAVar3);
    pAVar3 = this->RealPickup;
    if (((this->super_AInventory).super_AActor.flags.Value & 0x20000) == 0) {
      pbVar1 = (byte *)((long)&(pAVar3->super_AActor).flags.Value + 2);
      *pbVar1 = *pbVar1 & 0xfd;
    }
    if (this->droppedbymonster == true) {
      ModifyDropAmount(pAVar3,0);
      pAVar3 = this->RealPickup;
    }
    bVar2 = AInventory::CallTryPickup(pAVar3,*toucher,(AActor **)0x0);
    if (bVar2) {
      AInventory::GoAwayAndDie(&this->super_AInventory);
      return true;
    }
    (*(this->RealPickup->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
    this->RealPickup = (AInventory *)0x0;
  }
  return false;
}

Assistant:

bool ADehackedPickup::TryPickup (AActor *&toucher)
{
	PClassActor *type = DetermineType ();
	if (type == NULL)
	{
		return false;
	}
	RealPickup = static_cast<AInventory *>(Spawn (type, Pos(), NO_REPLACE));
	if (RealPickup != NULL)
	{
		// The internally spawned item should never count towards statistics.
		RealPickup->ClearCounters();
		if (!(flags & MF_DROPPED))
		{
			RealPickup->flags &= ~MF_DROPPED;
		}
		// If this item has been dropped by a monster the
		// amount of ammo this gives must be adjusted.
		if (droppedbymonster)
		{
			ModifyDropAmount(RealPickup, 0);
		}
		if (!RealPickup->CallTryPickup (toucher))
		{
			RealPickup->Destroy ();
			RealPickup = NULL;
			return false;
		}
		GoAwayAndDie ();
		return true;
	}
	return false;
}